

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::write_to_file
          (CVmObjByteArray *this,CVmDataSource *fp,unsigned_long start_idx,unsigned_long len)

{
  int iVar1;
  unsigned_long uVar2;
  size_t *in_RCX;
  ulong in_RDX;
  long *in_RSI;
  size_t chunk;
  size_t avail;
  uchar *p;
  unsigned_long idx;
  unsigned_long rem;
  size_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  CVmObjByteArray *in_stack_ffffffffffffffc0;
  size_t *local_30;
  size_t *local_28;
  
  if (in_RDX == 0) {
    err_throw(0);
  }
  uVar2 = get_element_count((CVmObjByteArray *)0x2c7098);
  if (in_RDX <= uVar2) {
    uVar2 = get_element_count((CVmObjByteArray *)0x2c70ce);
    local_28 = in_RCX;
    if (uVar2 < (long)in_RCX + (in_RDX - 1)) {
      uVar2 = get_element_count((CVmObjByteArray *)0x2c70e4);
      local_28 = (size_t *)((uVar2 - in_RDX) + 1);
    }
    for (local_30 = local_28; local_30 != (size_t *)0x0;
        local_30 = (size_t *)((long)local_30 - (long)in_stack_ffffffffffffffb0)) {
      in_stack_ffffffffffffffc0 =
           (CVmObjByteArray *)
           get_ele_ptr(in_stack_ffffffffffffffc0,(unsigned_long)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb8;
      if (local_30 < in_stack_ffffffffffffffb8) {
        in_stack_ffffffffffffffb0 = local_30;
      }
      iVar1 = (**(code **)(*in_RSI + 0x20))
                        (in_RSI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int CVmObjByteArray::write_to_file(CVmDataSource *fp, unsigned long start_idx,
                                   unsigned long len) const
{
    unsigned long rem;
    unsigned long idx;

    /* make sure the starting index is valid */
    if (start_idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    
    /* 
     *   if the starting index is past the end of the array, there's nothing
     *   to do - just return success
     */
    if (start_idx > get_element_count())
        return 0;

    /* 
     *   limit the request to the number of bytes available after the
     *   starting index 
     */
    if (start_idx + len - 1 > get_element_count())
        len = get_element_count() - start_idx + 1;

    /* keep going until we satisfy the request or run into a problem */
    for (idx = start_idx, rem = len ; rem != 0 ; )
    {
        unsigned char *p;
        size_t avail;
        size_t chunk;
        
        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit writing to the amount remaining of the requested size */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* 
         *   write out this chunk - if an error occurs, abort with a failure
         *   indication 
         */
        if (fp->write(p, chunk))
            return 1;

        /* move our counters past this chunk */
        idx += chunk;
        rem -= chunk;
    }

    /* we satisfied the request without problems - indicate success */
    return 0;
}